

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_printf_internal(JSContext *ctx,int argc,JSValue *argv,FILE *fp)

{
  byte bVar1;
  byte bVar2;
  int64_t iVar3;
  int iVar4;
  JSRuntime *opaque;
  byte *pbVar5;
  byte *pbVar6;
  uint8_t *p_00;
  char *ptr;
  byte *ptr_00;
  size_t sVar7;
  size_t len;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  JSValue JVar12;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val1;
  JSValue val1_00;
  JSValue val_03;
  int32_t int32_arg;
  char fmtbuf [32];
  int64_t int64_arg;
  DynBuf dbuf;
  double double_arg;
  size_t fmt_len;
  uint8_t *p;
  uint8_t cbuf [7];
  int local_d4;
  uint local_d0;
  int local_cc;
  FILE *local_c8;
  JSValue *local_c0;
  byte local_b8 [32];
  byte *local_98;
  uint local_90;
  undefined4 uStack_8c;
  DynBuf local_88;
  ulong local_58;
  double local_50;
  size_t local_48;
  byte *local_40;
  uint8_t local_37 [7];
  
  opaque = JS_GetRuntime(ctx);
  dbuf_init2(&local_88,opaque,js_realloc_rt);
  if (0 < argc) {
    pbVar5 = (byte *)JS_ToCStringLen2(ctx,&local_48,*argv,0);
    JVar12 = (JSValue)(ZEXT816(6) << 0x40);
    if (pbVar5 == (byte *)0x0) goto LAB_001116ae;
    ptr_00 = pbVar5;
    local_cc = argc;
    local_c0 = argv;
    if (0 < (long)local_48) {
      pbVar8 = pbVar5 + local_48;
      local_d4 = 1;
      local_98 = pbVar5;
LAB_00111137:
      bVar11 = true;
      pbVar6 = pbVar5;
      local_40 = pbVar5;
      if (*pbVar5 != 0x25) {
        len = 1;
        do {
          pbVar6 = pbVar6 + 1;
          bVar11 = pbVar6 < pbVar8;
          if (!bVar11) {
            dbuf_put(&local_88,pbVar5,len);
            ptr_00 = local_98;
            goto LAB_00111668;
          }
          len = len + 1;
        } while (*pbVar6 != 0x25);
      }
      dbuf_put(&local_88,pbVar5,(long)pbVar6 - (long)pbVar5);
      ptr_00 = local_98;
      if (bVar11) {
        local_b8[0] = *pbVar6;
        uVar9 = 0;
        while( true ) {
          uVar10 = (ulong)pbVar6[uVar9 + 1];
          local_c8 = (FILE *)fp;
          if (0x30 < uVar10) break;
          if ((0x1288900000000U >> (uVar10 & 0x3f) & 1) == 0) {
            if (uVar10 == 0x2a) {
              if (local_cc <= local_d4) goto LAB_001116dd;
              val.tag = local_c0[local_d4].tag;
              val.u.ptr = local_c0[local_d4].u.ptr;
              iVar4 = JS_ToInt32(ctx,(int32_t *)&local_d0,val);
              if (iVar4 != 0) goto LAB_001116f6;
              local_d4 = local_d4 + 1;
              iVar4 = snprintf((char *)(local_b8 + uVar9 + 1),0x1f - uVar9,"%d",(ulong)local_d0);
              pbVar6 = pbVar6 + uVar9 + 2;
              uVar10 = uVar9 + (long)iVar4 + 1;
              goto LAB_0011127f;
            }
            break;
          }
          if (uVar9 == 0x1e) goto switchD_0011139d_caseD_62;
          local_b8[uVar9 + 1] = pbVar6[uVar9 + 1];
          uVar9 = uVar9 + 1;
        }
        pbVar6 = pbVar6 + uVar9 + 1;
        bVar1 = *pbVar6;
        while (uVar10 = uVar9 + 1, 0xfffffff5 < bVar1 - 0x3a) {
          if (0x1e < uVar10) goto switchD_0011139d_caseD_62;
          local_b8[uVar9 + 1] = bVar1;
          pbVar5 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
          uVar9 = uVar10;
          bVar1 = *pbVar5;
        }
LAB_0011127f:
        if (*pbVar6 == 0x2e) {
          if (0x1e < (long)uVar10) goto switchD_0011139d_caseD_62;
          local_b8[uVar10] = 0x2e;
          if (pbVar6[1] != 0x2a) {
            pbVar6 = pbVar6 + 1;
            bVar1 = *pbVar6;
            uVar10 = uVar10 + 1;
            while (0xfffffff5 < bVar1 - 0x3a) {
              if (uVar10 == 0x1f) goto switchD_0011139d_caseD_62;
              local_b8[uVar10] = bVar1;
              uVar10 = uVar10 + 1;
              pbVar5 = pbVar6 + 1;
              pbVar6 = pbVar6 + 1;
              bVar1 = *pbVar5;
            }
            goto LAB_00111346;
          }
          if (local_cc <= local_d4) goto LAB_001116dd;
          val_00.tag = local_c0[local_d4].tag;
          val_00.u.ptr = local_c0[local_d4].u.ptr;
          iVar4 = JS_ToInt32(ctx,(int32_t *)&local_d0,val_00);
          if (iVar4 == 0) {
            local_d4 = local_d4 + 1;
            iVar4 = snprintf((char *)(local_b8 + uVar10 + 1),0x1f - uVar10,"%d",(ulong)local_d0);
            uVar10 = uVar10 + 1 + (long)iVar4;
            pbVar6 = pbVar6 + 2;
            goto LAB_00111346;
          }
LAB_001116f6:
          JVar12 = (JSValue)(ZEXT816(6) << 0x40);
          goto LAB_001116ae;
        }
LAB_00111346:
        bVar1 = *pbVar6;
        if (0x1e < (long)uVar10) goto switchD_0011139d_caseD_62;
        uVar9 = (ulong)(bVar1 == 0x6c);
        bVar2 = pbVar6[uVar9];
        local_b8[uVar10] = bVar2;
        local_b8[uVar10 + 1] = 0;
        local_58 = uVar9;
        if (bVar2 < 0x58) {
          if (2 < bVar2 - 0x45) {
            if (bVar2 == 0x25) {
              dbuf_putc(&local_88,'%');
              fp = (FILE *)local_c8;
              goto LAB_001115c1;
            }
            if (bVar2 != 0x41) goto switchD_0011139d_caseD_62;
          }
switchD_0011139d_caseD_61:
          if (local_d4 < local_cc) {
            val_02.tag = local_c0[local_d4].tag;
            val_02.u.ptr = local_c0[local_d4].u.ptr;
            iVar4 = JS_ToFloat64(ctx,&local_50,val_02);
            if (iVar4 != 0) goto LAB_001116f6;
            local_d4 = local_d4 + 1;
            dbuf_printf(&local_88,(char *)local_b8,local_50);
            fp = (FILE *)local_c8;
            goto LAB_001115c1;
          }
LAB_001116dd:
          JS_ThrowReferenceError(ctx,"missing argument for conversion specifier");
          goto LAB_00111652;
        }
        switch(bVar2) {
        case 0x61:
        case 0x65:
        case 0x66:
        case 0x67:
          goto switchD_0011139d_caseD_61;
        case 99:
          if (local_cc <= local_d4) goto LAB_001116dd;
          iVar3 = local_c0[local_d4].tag;
          if ((int)iVar3 == -7) {
            val1.tag = iVar3;
            val1.u.ptr = local_c0[local_d4].u.ptr;
            p_00 = (uint8_t *)JS_ToCStringLen2(ctx,(size_t *)0x0,val1,0);
            if (p_00 != (uint8_t *)0x0) {
              local_d0 = unicode_from_utf8(p_00,6,&local_40);
              JS_FreeCString(ctx,(char *)p_00);
LAB_001115fc:
              fp = (FILE *)local_c8;
              if (0x10ffff < local_d0) {
                local_d0 = 0xfffd;
              }
              local_d4 = local_d4 + 1;
              iVar4 = unicode_to_utf8(local_37,local_d0);
              dbuf_put(&local_88,local_37,(long)iVar4);
              goto LAB_001115c1;
            }
          }
          else {
            val_03.tag = iVar3;
            val_03.u.ptr = local_c0[local_d4].u.ptr;
            iVar4 = JS_ToInt32(ctx,(int32_t *)&local_d0,val_03);
            if (iVar4 == 0) goto LAB_001115fc;
          }
          goto LAB_00111652;
        case 100:
        case 0x69:
        case 0x6f:
        case 0x75:
        case 0x78:
switchD_0011139d_caseD_64:
          if (local_cc <= local_d4) goto LAB_001116dd;
          val_01.tag = local_c0[local_d4].tag;
          val_01.u.ptr = local_c0[local_d4].u.ptr;
          iVar4 = JS_ToInt64Ext(ctx,(int64_t *)&local_90,val_01);
          if (iVar4 != 0) goto LAB_001116f6;
          local_d4 = local_d4 + 1;
          if (bVar1 == 0x6c) {
            if (0x1c < (long)uVar10) goto switchD_0011139d_caseD_62;
            local_b8[uVar10 + 2] = local_b8[uVar10];
            (local_b8 + uVar10)[0] = 0x6c;
            (local_b8 + uVar10)[1] = 0x6c;
            local_b8[uVar10 + 3] = 0;
            dbuf_printf(&local_88,(char *)local_b8,CONCAT44(uStack_8c,local_90));
            fp = (FILE *)local_c8;
          }
          else {
            dbuf_printf(&local_88,(char *)local_b8,(ulong)local_90);
            fp = (FILE *)local_c8;
          }
          goto LAB_001115c1;
        case 0x73:
          goto switchD_0011139d_caseD_73;
        default:
          if (bVar2 == 0x58) goto switchD_0011139d_caseD_64;
        case 0x62:
        case 0x68:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x76:
        case 0x77:
switchD_0011139d_caseD_62:
          JS_ThrowTypeError(ctx,"invalid conversion specifier in format string");
LAB_00111652:
          JVar12 = (JSValue)(ZEXT816(6) << 0x40);
          goto LAB_001116ae;
        }
      }
    }
LAB_00111668:
    JS_FreeCString(ctx,(char *)ptr_00);
  }
  if (local_88.error == 0) {
    if ((FILE *)fp == (FILE *)0x0) {
      JVar12 = JS_NewStringLen(ctx,(char *)local_88.buf,local_88.size);
    }
    else {
      sVar7 = fwrite(local_88.buf,1,local_88.size,(FILE *)fp);
      JVar12.tag = 0;
      JVar12.u.ptr = (void *)(sVar7 & 0xffffffff);
    }
  }
  else {
    JVar12 = JS_ThrowOutOfMemory(ctx);
  }
LAB_001116ae:
  dbuf_free(&local_88);
  return JVar12;
switchD_0011139d_caseD_73:
  if (local_cc <= local_d4) goto LAB_001116dd;
  val1_00.tag = local_c0[local_d4].tag;
  val1_00.u.ptr = local_c0[local_d4].u.ptr;
  ptr = JS_ToCStringLen2(ctx,(size_t *)0x0,val1_00,0);
  if (ptr == (char *)0x0) goto LAB_001116f6;
  local_d4 = local_d4 + 1;
  dbuf_printf(&local_88,(char *)local_b8,ptr);
  JS_FreeCString(ctx,ptr);
  fp = (FILE *)local_c8;
LAB_001115c1:
  pbVar5 = pbVar6 + local_58 + 1;
  ptr_00 = local_98;
  if (pbVar8 <= pbVar5) goto LAB_00111668;
  goto LAB_00111137;
}

Assistant:

static JSValue js_printf_internal(JSContext *ctx,
                                  int argc, JSValueConst *argv, FILE *fp)
{
    char fmtbuf[32];
    uint8_t cbuf[UTF8_CHAR_LEN_MAX+1];
    JSValue res;
    DynBuf dbuf;
    const char *fmt_str;
    const uint8_t *fmt, *fmt_end;
    const uint8_t *p;
    char *q;
    int i, c, len, mod;
    size_t fmt_len;
    int32_t int32_arg;
    int64_t int64_arg;
    double double_arg;
    const char *string_arg;
    /* Use indirect call to dbuf_printf to prevent gcc warning */
    int (*dbuf_printf_fun)(DynBuf *s, const char *fmt, ...) = (void*)dbuf_printf;

    js_std_dbuf_init(ctx, &dbuf);

    if (argc > 0) {
        fmt_str = JS_ToCStringLen(ctx, &fmt_len, argv[0]);
        if (!fmt_str)
            goto fail;

        i = 1;
        fmt = (const uint8_t *)fmt_str;
        fmt_end = fmt + fmt_len;
        while (fmt < fmt_end) {
            for (p = fmt; fmt < fmt_end && *fmt != '%'; fmt++)
                continue;
            dbuf_put(&dbuf, p, fmt - p);
            if (fmt >= fmt_end)
                break;
            q = fmtbuf;
            *q++ = *fmt++;  /* copy '%' */
            
            /* flags */
            for(;;) {
                c = *fmt;
                if (c == '0' || c == '#' || c == '+' || c == '-' || c == ' ' ||
                    c == '\'') {
                    if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                        goto invalid;
                    *q++ = c;
                    fmt++;
                } else {
                    break;
                }
            }
            /* width */
            if (*fmt == '*') {
                if (i >= argc)
                    goto missing;
                if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                    goto fail;
                q += snprintf(q, fmtbuf + sizeof(fmtbuf) - q, "%d", int32_arg);
                fmt++;
            } else {
                while (my_isdigit(*fmt)) {
                    if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                        goto invalid;
                    *q++ = *fmt++;
                }
            }
            if (*fmt == '.') {
                if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                    goto invalid;
                *q++ = *fmt++;
                if (*fmt == '*') {
                    if (i >= argc)
                        goto missing;
                    if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                        goto fail;
                    q += snprintf(q, fmtbuf + sizeof(fmtbuf) - q, "%d", int32_arg);
                    fmt++;
                } else {
                    while (my_isdigit(*fmt)) {
                        if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                            goto invalid;
                        *q++ = *fmt++;
                    }
                }
            }

            /* we only support the "l" modifier for 64 bit numbers */
            mod = ' ';
            if (*fmt == 'l') {
                mod = *fmt++;
            }
            
            /* type */
            c = *fmt++;
            if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                goto invalid;
            *q++ = c;
            *q = '\0';
            
            switch (c) {
            case 'c':
                if (i >= argc)
                    goto missing;
                if (JS_IsString(argv[i])) {
                    string_arg = JS_ToCString(ctx, argv[i++]);
                    if (!string_arg)
                        goto fail;
                    int32_arg = unicode_from_utf8((uint8_t *)string_arg, UTF8_CHAR_LEN_MAX, &p);
                    JS_FreeCString(ctx, string_arg);
                } else {
                    if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                        goto fail;
                }
                /* handle utf-8 encoding explicitly */
                if ((unsigned)int32_arg > 0x10FFFF)
                    int32_arg = 0xFFFD;
                /* ignore conversion flags, width and precision */
                len = unicode_to_utf8(cbuf, int32_arg);
                dbuf_put(&dbuf, cbuf, len);
                break;
                
            case 'd':
            case 'i':
            case 'o':
            case 'u':
            case 'x':
            case 'X':
                if (i >= argc)
                    goto missing;
                if (JS_ToInt64Ext(ctx, &int64_arg, argv[i++]))
                    goto fail;
                if (mod == 'l') {
                    /* 64 bit number */
#if defined(_WIN32)
                    if (q >= fmtbuf + sizeof(fmtbuf) - 3)
                        goto invalid;
                    q[2] = q[-1];
                    q[-1] = 'I';
                    q[0] = '6';
                    q[1] = '4';
                    q[3] = '\0';
                    dbuf_printf_fun(&dbuf, fmtbuf, (int64_t)int64_arg);
#else
                    if (q >= fmtbuf + sizeof(fmtbuf) - 2)
                        goto invalid;
                    q[1] = q[-1];
                    q[-1] = q[0] = 'l';
                    q[2] = '\0';
                    dbuf_printf_fun(&dbuf, fmtbuf, (long long)int64_arg);
#endif
                } else {
                    dbuf_printf_fun(&dbuf, fmtbuf, (int)int64_arg);
                }
                break;

            case 's':
                if (i >= argc)
                    goto missing;
                /* XXX: handle strings containing null characters */
                string_arg = JS_ToCString(ctx, argv[i++]);
                if (!string_arg)
                    goto fail;
                dbuf_printf_fun(&dbuf, fmtbuf, string_arg);
                JS_FreeCString(ctx, string_arg);
                break;
                
            case 'e':
            case 'f':
            case 'g':
            case 'a':
            case 'E':
            case 'F':
            case 'G':
            case 'A':
                if (i >= argc)
                    goto missing;
                if (JS_ToFloat64(ctx, &double_arg, argv[i++]))
                    goto fail;
                dbuf_printf_fun(&dbuf, fmtbuf, double_arg);
                break;
                
            case '%':
                dbuf_putc(&dbuf, '%');
                break;
                
            default:
                /* XXX: should support an extension mechanism */
            invalid:
                JS_ThrowTypeError(ctx, "invalid conversion specifier in format string");
                goto fail;
            missing:
                JS_ThrowReferenceError(ctx, "missing argument for conversion specifier");
                goto fail;
            }
        }
        JS_FreeCString(ctx, fmt_str);
    }
    if (dbuf.error) {
        res = JS_ThrowOutOfMemory(ctx);
    } else {
        if (fp) {
            len = fwrite(dbuf.buf, 1, dbuf.size, fp);
            res = JS_NewInt32(ctx, len);
        } else {
            res = JS_NewStringLen(ctx, (char *)dbuf.buf, dbuf.size);
        }
    }
    dbuf_free(&dbuf);
    return res;

fail:
    dbuf_free(&dbuf);
    return JS_EXCEPTION;
}